

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<float>::add_blocked_sample(TypedTimeSamples<float> *this,double t)

{
  pointer *ppSVar1;
  iterator __position;
  Sample s;
  Sample local_18;
  
  local_18.blocked = true;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<float>::Sample,std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<float>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<float>::Sample,std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>>
                *)this,__position,&local_18);
  }
  else {
    (__position._M_current)->t = t;
    (__position._M_current)->value = local_18.value;
    (__position._M_current)->blocked = true;
    *(undefined3 *)&(__position._M_current)->field_0xd = local_18._13_3_;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }